

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::
ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithDuplicatePolicyOid_Test::
ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithDuplicatePolicyOid_Test
          (ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithDuplicatePolicyOid_Test *this)

{
  ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithDuplicatePolicyOid_Test *this_local;
  
  ParseCertificatePoliciesExtensionOidsTest::ParseCertificatePoliciesExtensionOidsTest
            (&this->super_ParseCertificatePoliciesExtensionOidsTest);
  (this->super_ParseCertificatePoliciesExtensionOidsTest).super_TestWithParam<bool>.super_Test.
  _vptr_Test = (_func_int **)
               &
               PTR__ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithDuplicatePolicyOid_Test_00916e60
  ;
  (this->super_ParseCertificatePoliciesExtensionOidsTest).super_TestWithParam<bool>.
  super_WithParamInterface<bool>._vptr_WithParamInterface = (_func_int **)&DAT_00916ea0;
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest,
       InvalidPolicyWithDuplicatePolicyOid) {
  std::string der;
  ASSERT_TRUE(LoadTestData("invalid-policy_1_2_3_dupe.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_FALSE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
}